

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_decoder_config *
ma_decoder_config_init
          (ma_decoder_config *__return_storage_ptr__,ma_format outputFormat,ma_uint32 outputChannels
          ,ma_uint32 outputSampleRate)

{
  if (__return_storage_ptr__ != (ma_decoder_config *)0x0) {
    memset(__return_storage_ptr__,0,0x90);
  }
  __return_storage_ptr__->format = outputFormat;
  __return_storage_ptr__->channels = outputChannels;
  __return_storage_ptr__->sampleRate = outputSampleRate;
  (__return_storage_ptr__->resampling).format = ma_format_unknown;
  (__return_storage_ptr__->resampling).channels = 0;
  (__return_storage_ptr__->resampling).sampleRateIn = 0;
  (__return_storage_ptr__->resampling).sampleRateOut = 0;
  *(undefined8 *)&(__return_storage_ptr__->resampling).algorithm = 0;
  (__return_storage_ptr__->resampling).pBackendVTable = (ma_resampling_backend_vtable *)0x0;
  (__return_storage_ptr__->resampling).pBackendUserData = (void *)0x0;
  *(undefined8 *)&(__return_storage_ptr__->resampling).linear = 4;
  __return_storage_ptr__->encodingFormat = ma_encoding_format_unknown;
  return __return_storage_ptr__;
}

Assistant:

MA_API ma_decoder_config ma_decoder_config_init(ma_format outputFormat, ma_uint32 outputChannels, ma_uint32 outputSampleRate)
{
    ma_decoder_config config;
    MA_ZERO_OBJECT(&config);
    config.format         = outputFormat;
    config.channels       = outputChannels;
    config.sampleRate     = outputSampleRate;
    config.resampling     = ma_resampler_config_init(ma_format_unknown, 0, 0, 0, ma_resample_algorithm_linear); /* Format/channels/rate doesn't matter here. */
    config.encodingFormat = ma_encoding_format_unknown;

    /* Note that we are intentionally leaving the channel map empty here which will cause the default channel map to be used. */

    return config;
}